

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Voice::set(V2Voice *this,syVV2 *para)

{
  float fVar1;
  float fVar2;
  int local_30;
  int local_2c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  float x;
  float p;
  syVV2 *para_local;
  V2Voice *this_local;
  
  this->xpose = para->transp - 64.0;
  updateNote(this);
  this->fmode = (int)para->routing;
  this->keysync = (int)para->oscsync;
  fVar1 = para->panning / 128.0;
  fVar2 = sqrtf(1.0 - fVar1);
  this->lvol = fVar2;
  fVar1 = sqrtf(fVar1);
  this->rvol = fVar1;
  fVar1 = (para->fltbal - 64.0) / 64.0;
  if (fVar1 < 0.0) {
    this->f1gain = 1.0;
    this->f2gain = fVar1 + 1.0;
  }
  else {
    this->f2gain = 1.0;
    this->f1gain = 1.0 - fVar1;
  }
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    V2Osc::set(this->osc + i_2,para->osc + i_2);
  }
  for (i_3 = 0; i_3 < 2; i_3 = i_3 + 1) {
    V2Env::set(this->env + i_3,para->env + i_3);
  }
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    V2Flt::set(this->vcf + local_2c,para->flt + local_2c);
  }
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    V2LFO::set(this->lfo + local_30,para->lfo + local_30);
  }
  V2Dist::set(&this->dist,&para->dist);
  return;
}

Assistant:

void set(const syVV2 *para)
    {
        xpose = para->transp - 64.0f;
        updateNote();

        fmode = (int)para->routing;
        keysync = (int)para->oscsync;

        // equal power panning
        float p = para->panning / 128.0f;
        lvol = sqrtf(1.0f - p);
        rvol = sqrtf(p);

        // filter balance for parallel
        float x = (para->fltbal - 64.0f) / 64.0f;
        if (x >= 0.0f)
        {
            f2gain = 1.0f;
            f1gain = 1.0f - x;
        }
        else
        {
            f1gain = 1.0f;
            f2gain = 1.0f + x;
        }

        // subsections
        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].set(&para->osc[i]);

        for (int i=0; i < syVV2::NENV; i++)
            env[i].set(&para->env[i]);

        for (int i=0; i < syVV2::NFLT; i++)
            vcf[i].set(&para->flt[i]);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].set(&para->lfo[i]);

        dist.set(&para->dist);
    }